

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::Electromagnetic_Emission_PDU
          (Electromagnetic_Emission_PDU *this,EntityIdentifier *EmittingID,EntityIdentifier *EventID
          ,StateUpdateIndicator SUI)

{
  StateUpdateIndicator SUI_local;
  EntityIdentifier *EventID_local;
  EntityIdentifier *EmittingID_local;
  Electromagnetic_Emission_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Electromagnetic_Emission_PDU_0032dd98;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EmittingEntityID,EmittingID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID,EventID);
  this->m_ui8StateUpdateIndicator = (KUINT8)SUI;
  this->m_ui8NumberOfEmissionSystems = '\0';
  this->m_ui16Padding = 0;
  std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
  vector(&this->m_vEmissionSystem);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui8PDUType = '\x17';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x1c;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Electromagnetic_Emission_PDU::Electromagnetic_Emission_PDU( const EntityIdentifier & EmittingID, const EntityIdentifier & EventID,
        StateUpdateIndicator SUI ) :
    m_EmittingEntityID( EmittingID ),
    m_EventID( EventID ),
    m_ui8StateUpdateIndicator( SUI ),
    m_ui8NumberOfEmissionSystems( 0 ),
    m_ui16Padding( 0 )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = Electromagnetic_Emission_PDU_Type;
    m_ui16PDULength = ELECTROMAGNETIC_EMISSION_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}